

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractSyntaxTree.cpp
# Opt level: O0

void __thiscall MyCompiler::Program::Program(Program *this)

{
  allocator local_31;
  string local_30 [32];
  Program *local_10;
  Program *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Program",&local_31);
  AbstractAstNode::AbstractAstNode(&this->super_AbstractAstNode,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::shared_ptr<MyCompiler::Block>::shared_ptr(&this->pBlock);
  return;
}

Assistant:

MyCompiler::Program::Program()
        : AbstractAstNode("Program")
{}